

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O0

vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> * __thiscall
dg::vr::VRLocation::getPredLocations(VRLocation *this)

{
  bool bVar1;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *in_RSI;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *in_RDI;
  VREdge *edge;
  iterator __end2;
  iterator __begin2;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *__range2;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *result;
  vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_> *in_stack_ffffffffffffffa8;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *__x;
  __normal_iterator<dg::vr::VREdge_**,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
  local_28;
  vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>::vector
            ((vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> *)0x1bfd2f);
  local_20 = in_RSI + 10;
  local_28._M_current =
       (VREdge **)
       std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>::begin
                 (in_stack_ffffffffffffffa8);
  std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::vr::VREdge_**,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<dg::vr::VREdge_**,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
                             *)in_stack_ffffffffffffffa8), bVar1) {
    __gnu_cxx::
    __normal_iterator<dg::vr::VREdge_**,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
    ::operator*(&local_28);
    std::vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>::push_back
              (in_RSI,(value_type *)__x);
    __gnu_cxx::
    __normal_iterator<dg::vr::VREdge_**,_std::vector<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>_>
    ::operator++(&local_28);
  }
  return __x;
}

Assistant:

std::vector<VRLocation *> VRLocation::getPredLocations() {
    std::vector<VRLocation *> result;
    for (VREdge *edge : predecessors) {
        result.push_back(edge->source);
    }
    return result;
}